

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

bool __thiscall Character::AddItem(Character *this,short item,int amount)

{
  list<Character_Item,_std::allocator<Character_Item>_> *plVar1;
  size_t *psVar2;
  EIF *pEVar3;
  World *pWVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  mapped_type *this_00;
  _List_node_base *p_Var10;
  key_type local_50;
  
  if (0 < item && 0 < amount) {
    uVar5 = (ulong)(ushort)item;
    pEVar3 = this->world->eif;
    uVar9 = ((long)(pEVar3->data).
                   super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pEVar3->data).
                   super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
    if (uVar5 <= uVar9 && uVar9 - uVar5 != 0) {
      plVar1 = &this->inventory;
      p_Var10 = (_List_node_base *)plVar1;
      do {
        p_Var10 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)&p_Var10->_M_next
                   )->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var10 == (_List_node_base *)plVar1) goto LAB_001175b9;
      } while (*(short *)&p_Var10[1]._M_next != item);
      iVar7 = *(int *)((long)&p_Var10[1]._M_next + 4) + amount;
      if (iVar7 < 0) {
        uVar9 = 0;
      }
      else {
        *(int *)((long)&p_Var10[1]._M_next + 4) = iVar7;
        pWVar4 = this->world;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MaxItem","");
        this_00 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&pWVar4->config,&local_50);
        iVar8 = util::variant::GetInt(this_00);
        iVar7 = *(int *)((long)&p_Var10[1]._M_next + 4);
        if (iVar8 < iVar7) {
          iVar7 = iVar8;
        }
        *(int *)((long)&p_Var10[1]._M_next + 4) = iVar7;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        CalculateStats(this,true);
        uVar9 = 1;
      }
LAB_001175b9:
      bVar6 = (byte)uVar9;
      if (p_Var10 == (_List_node_base *)plVar1) {
        p_Var10 = (_List_node_base *)operator_new(0x18);
        p_Var10[1]._M_next = (_List_node_base *)((ulong)(uint)amount << 0x20 | uVar5);
        std::__detail::_List_node_base::_M_hook(p_Var10);
        psVar2 = &(this->inventory).
                  super__List_base<Character_Item,_std::allocator<Character_Item>_>._M_impl._M_node.
                  _M_size;
        *psVar2 = *psVar2 + 1;
        CalculateStats(this,true);
        bVar6 = 1;
      }
      goto LAB_001175a6;
    }
  }
  bVar6 = 0;
LAB_001175a6:
  return (bool)(bVar6 & 1);
}

Assistant:

bool Character::AddItem(short item, int amount)
{
	if (amount <= 0)
	{
		return false;
	}

	if (item <= 0 || static_cast<std::size_t>(item) >= this->world->eif->data.size())
	{
		return false;
	}

	UTIL_IFOREACH(this->inventory, it)
	{
		if (it->id == item)
		{
			if (it->amount + amount < 0)
			{
				return false;
			}

			it->amount += amount;

			it->amount = std::min<int>(it->amount, this->world->config["MaxItem"]);

			this->CalculateStats();

			return true;
		}
	}

	Character_Item newitem;
	newitem.id = item;
	newitem.amount = amount;

	this->inventory.push_back(newitem);

	this->CalculateStats();

	return true;
}